

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void cdef_row_mt_sync_read(AV1CdefSync *cdef_sync,int row)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  AV1CdefRowSync *cdef_row_mt;
  
  if (in_ESI != 0) {
    lVar1 = *(long *)(in_RDI + 8);
    pthread_mutex_lock(*(pthread_mutex_t **)(lVar1 + (long)(in_ESI + -1) * 0x18));
    while (*(int *)(lVar1 + (long)(in_ESI + -1) * 0x18 + 0x10) != 1) {
      pthread_cond_wait(*(pthread_cond_t **)(lVar1 + (long)(in_ESI + -1) * 0x18 + 8),
                        *(pthread_mutex_t **)(lVar1 + (long)(in_ESI + -1) * 0x18));
    }
    *(undefined4 *)(lVar1 + (long)(in_ESI + -1) * 0x18 + 0x10) = 0;
    pthread_mutex_unlock(*(pthread_mutex_t **)(lVar1 + (long)(in_ESI + -1) * 0x18));
  }
  return;
}

Assistant:

static inline void cdef_row_mt_sync_read(AV1CdefSync *const cdef_sync,
                                         int row) {
  if (!row) return;
#if CONFIG_MULTITHREAD
  AV1CdefRowSync *const cdef_row_mt = cdef_sync->cdef_row_mt;
  pthread_mutex_lock(cdef_row_mt[row - 1].row_mutex_);
  while (cdef_row_mt[row - 1].is_row_done != 1)
    pthread_cond_wait(cdef_row_mt[row - 1].row_cond_,
                      cdef_row_mt[row - 1].row_mutex_);
  cdef_row_mt[row - 1].is_row_done = 0;
  pthread_mutex_unlock(cdef_row_mt[row - 1].row_mutex_);
#else
  (void)cdef_sync;
#endif  // CONFIG_MULTITHREAD
}